

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

QPDFFormFieldObjectHelper * __thiscall
QPDFAcroFormDocumentHelper::getFieldForAnnotation
          (QPDFFormFieldObjectHelper *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,
          QPDFAnnotationObjectHelper *h)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  QPDFObjGen local_b0;
  QPDFObjGen og;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  QPDFObjectHandle local_48;
  undefined1 local_31;
  QPDFObjectHandle oh;
  QPDFAnnotationObjectHelper *h_local;
  QPDFAcroFormDocumentHelper *this_local;
  QPDFFormFieldObjectHelper *result;
  
  oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)h;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  local_31 = 0;
  QPDFObjectHandle::newNull();
  QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(__return_storage_ptr__,&local_48);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"/Widget",(allocator<char> *)((long)&og.gen + 3));
  bVar1 = QPDFObjectHandle::isDictionaryOfType
                    ((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&og.gen + 3));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    analyze(this);
    local_b0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&stack0xffffffffffffffd0);
    peVar2 = std::
             __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    sVar3 = std::
            map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
            ::count(&peVar2->annotation_to_field,&local_b0);
    if (sVar3 != 0) {
      peVar2 = std::
               __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m);
      pmVar4 = std::
               map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
               ::operator[](&peVar2->annotation_to_field,&local_b0);
      QPDFFormFieldObjectHelper::operator=(__return_storage_ptr__,pmVar4);
    }
  }
  local_31 = 1;
  og.obj = 1;
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  return __return_storage_ptr__;
}

Assistant:

QPDFFormFieldObjectHelper
QPDFAcroFormDocumentHelper::getFieldForAnnotation(QPDFAnnotationObjectHelper h)
{
    QPDFObjectHandle oh = h.getObjectHandle();
    QPDFFormFieldObjectHelper result(QPDFObjectHandle::newNull());
    if (!oh.isDictionaryOfType("", "/Widget")) {
        return result;
    }
    analyze();
    QPDFObjGen og(oh.getObjGen());
    if (m->annotation_to_field.count(og)) {
        result = m->annotation_to_field[og];
    }
    return result;
}